

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImDrawList *pIVar1;
  float *pfVar2;
  ImGuiNavMoveResult *pIVar3;
  ImGuiNextWindowData *pIVar4;
  int *piVar5;
  ImVec2 *pIVar6;
  ImVec2 *pIVar7;
  ImFontAtlas *pIVar8;
  char *pcVar9;
  ImVec2 IVar10;
  undefined1 auVar11 [16];
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  bool bVar15;
  int n;
  ImGuiID IVar16;
  ImGuiKeyModFlags IVar17;
  ImGuiInputSource IVar18;
  int iVar19;
  ImFont **ppIVar20;
  long lVar21;
  ImFont *font;
  ImGuiWindow *pIVar22;
  ImGuiPopupData *pIVar23;
  ImGuiWindow **ppIVar24;
  ImRect *pIVar25;
  int i_1;
  ImGuiID IVar26;
  ImGuiWindow *window;
  long lVar27;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar28;
  ImGuiNavDirSourceFlags dir_sources;
  ImGuiNavMoveResult *pIVar29;
  int i_2;
  int i;
  float *pfVar30;
  ImGuiNavLayer IVar31;
  float *pfVar32;
  byte bVar33;
  ImGuiContext *pIVar34;
  ImGuiWindow *old_nav_window;
  bool *pbVar35;
  bool bVar36;
  bool bVar37;
  byte bVar38;
  uint uVar39;
  uint uVar40;
  float fVar41;
  float fVar42;
  ImVec2 IVar43;
  ImVec2 IVar44;
  ImVec2 IVar45;
  ImVec2 IVar46;
  ImVec2 IVar47;
  ImVec2 IVar49;
  double dVar48;
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  long lStack_70;
  ImRect local_48;
  ImGuiContext *local_38;
  
  pIVar12 = GImGui;
  bVar38 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xe9b,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a95,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar19 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar19 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1a96,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar19 != 0) && (GImGui->FrameCountEnded != iVar19)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a97,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a98,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar8 = (GImGui->IO).Fonts;
  if ((pIVar8->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a99,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  ppIVar20 = ImVector<ImFont_*>::operator[](&pIVar8->Fonts,0);
  if ((*ppIVar20)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar12->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((pIVar12->Style).CircleSegmentMaxError <= 0.0) {
    __assert_fail("g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar41 = (pIVar12->Style).Alpha;
  if ((fVar41 < 0.0) || (1.0 < fVar41)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar12->Style).WindowMinSize.x < 1.0) || ((pIVar12->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (pIVar12->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1a9f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar21 = 0;
  while (lVar21 != 0x16) {
    piVar5 = (pIVar12->IO).KeyMap + lVar21;
    lVar21 = lVar21 + 1;
    if (0x200 < *piVar5 + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1aa1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  if ((((pIVar12->IO).ConfigFlags & 1) != 0) && ((pIVar12->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1aa5,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((pIVar12->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar12->IO).BackendFlags & 2) == 0)) {
    (pIVar12->IO).ConfigWindowsResizeFromEdges = false;
  }
  pIVar34 = GImGui;
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x25c8,"void ImGui::UpdateSettings()");
    }
    pcVar9 = (GImGui->IO).IniFilename;
    if (pcVar9 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar9);
    }
    pIVar34->SettingsLoaded = true;
  }
  if ((0.0 < pIVar34->SettingsDirtyTimer) &&
     (fVar41 = pIVar34->SettingsDirtyTimer - (pIVar34->IO).DeltaTime,
     pIVar34->SettingsDirtyTimer = fVar41, fVar41 <= 0.0)) {
    pcVar9 = (pIVar34->IO).IniFilename;
    if (pcVar9 == (char *)0x0) {
      (pIVar34->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar9);
    }
    pIVar34->SettingsDirtyTimer = 0.0;
  }
  pIVar12->Time = (double)(pIVar12->IO).DeltaTime + pIVar12->Time;
  pIVar12->WithinFrameScope = true;
  pIVar12->FrameCount = pIVar12->FrameCount + 1;
  pIVar12->TooltipOverrideCount = 0;
  pIVar12->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize(&pIVar12->MenusIdSubmittedThisFrame,0);
  fVar41 = (pIVar12->IO).DeltaTime;
  iVar19 = pIVar12->FramerateSecPerFrameIdx;
  pIVar12->FramerateSecPerFrameAccum =
       (fVar41 - pIVar12->FramerateSecPerFrame[iVar19]) + pIVar12->FramerateSecPerFrameAccum;
  pIVar12->FramerateSecPerFrame[iVar19] = fVar41;
  pIVar12->FramerateSecPerFrameIdx = (iVar19 + 1) % 0x78;
  uVar39 = -(uint)(0.0 < pIVar12->FramerateSecPerFrameAccum);
  (pIVar12->IO).Framerate =
       (float)(~uVar39 & 0x7f7fffff |
              (uint)(1.0 / (pIVar12->FramerateSecPerFrameAccum / 120.0)) & uVar39);
  ((pIVar12->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar12->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xeb8,"void ImGui::NewFrame()");
  }
  fVar41 = (pIVar12->IO).DisplaySize.x;
  fVar51 = (pIVar12->IO).DisplaySize.y;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.z = fVar41;
  (pIVar12->DrawListSharedData).ClipRectFullscreen.w = fVar51;
  fVar41 = (pIVar12->Style).CircleSegmentMaxError;
  (pIVar12->DrawListSharedData).CurveTessellationTol = (pIVar12->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&pIVar12->DrawListSharedData,fVar41);
  bVar14 = (pIVar12->Style).AntiAliasedLines;
  uVar39 = (uint)bVar14;
  (pIVar12->DrawListSharedData).InitialFlags = (uint)bVar14;
  if ((pIVar12->Style).AntiAliasedFill == true) {
    uVar39 = bVar14 | 2;
    (pIVar12->DrawListSharedData).InitialFlags = uVar39;
  }
  if (((pIVar12->IO).BackendFlags & 8) != 0) {
    (pIVar12->DrawListSharedData).InitialFlags = uVar39 | 4;
  }
  pIVar1 = &pIVar12->BackgroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar12->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  pIVar1 = &pIVar12->ForegroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar12->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar12->DrawData).Valid = false;
  (pIVar12->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar12->DrawData).CmdListsCount = 0;
  (pIVar12->DrawData).TotalIdxCount = 0;
  (pIVar12->DrawData).TotalVtxCount = 0;
  (pIVar12->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar12->DrawData).DisplayPos.y = 0;
  (pIVar12->DrawData).DisplaySize.x = 0.0;
  (pIVar12->DrawData).DisplaySize.y = 0.0;
  (pIVar12->DrawData).FramebufferScale.x = 0.0;
  (pIVar12->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar12->DragDropActive == true) &&
     (IVar26 = (pIVar12->DragDropPayload).SourceId, IVar26 == pIVar12->ActiveId)) {
    KeepAliveID(IVar26);
  }
  if (pIVar12->HoveredIdPreviousFrame == 0) {
    IVar26 = pIVar12->HoveredId;
    pIVar12->HoveredIdTimer = 0.0;
    pIVar12->HoveredIdNotActiveTimer = 0.0;
    if (IVar26 == 0) goto LAB_0014b17b;
LAB_0014b150:
    fVar41 = (pIVar12->IO).DeltaTime;
    pIVar12->HoveredIdTimer = pIVar12->HoveredIdTimer + fVar41;
    IVar16 = IVar26;
    if (pIVar12->ActiveId != IVar26) {
      pIVar12->HoveredIdNotActiveTimer = fVar41 + pIVar12->HoveredIdNotActiveTimer;
      IVar16 = pIVar12->ActiveId;
    }
  }
  else {
    IVar26 = pIVar12->HoveredId;
    if (IVar26 != 0) {
      if (pIVar12->ActiveId == IVar26) {
        pIVar12->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0014b150;
    }
LAB_0014b17b:
    IVar26 = 0;
    IVar16 = pIVar12->ActiveId;
  }
  pIVar12->HoveredIdPreviousFrame = IVar26;
  pIVar12->HoveredId = 0;
  pIVar12->HoveredIdAllowOverlap = false;
  if (((pIVar12->ActiveIdIsAlive != IVar16) && (IVar16 != 0)) &&
     (pIVar12->ActiveIdPreviousFrame == IVar16)) {
    ClearActiveID();
    IVar16 = pIVar12->ActiveId;
  }
  fVar41 = (pIVar12->IO).DeltaTime;
  if (IVar16 != 0) {
    pIVar12->ActiveIdTimer = pIVar12->ActiveIdTimer + fVar41;
  }
  pIVar12->LastActiveIdTimer = pIVar12->LastActiveIdTimer + fVar41;
  pIVar12->ActiveIdPreviousFrame = IVar16;
  pIVar12->ActiveIdPreviousFrameWindow = pIVar12->ActiveIdWindow;
  pIVar12->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar12->ActiveIdHasBeenEditedBefore;
  pIVar12->ActiveIdIsAlive = 0;
  pIVar12->ActiveIdHasBeenEditedThisFrame = false;
  pIVar12->ActiveIdPreviousFrameIsAlive = false;
  pIVar12->ActiveIdIsJustActivated = false;
  if (pIVar12->TempInputId == 0) {
LAB_0014b260:
    if (IVar16 == 0) {
      pIVar12->ActiveIdUsingNavDirMask = 0;
      pIVar12->ActiveIdUsingNavInputMask = 0;
      pIVar12->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar16 != pIVar12->TempInputId) {
    pIVar12->TempInputId = 0;
    goto LAB_0014b260;
  }
  pIVar12->DragDropAcceptIdPrev = pIVar12->DragDropAcceptIdCurr;
  pIVar12->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar12->DragDropAcceptIdCurr = 0;
  pIVar12->DragDropWithinSource = false;
  pIVar12->DragDropWithinTarget = false;
  pIVar12->DragDropHoldJustPressedId = 0;
  IVar17 = GetMergedKeyModFlags();
  (pIVar12->IO).KeyMods = IVar17;
  pfVar2 = (pIVar12->IO).KeysDownDuration;
  memcpy((pIVar12->IO).KeysDownDurationPrev,pfVar2,0x800);
  for (lVar21 = 0; pIVar34 = GImGui, lVar21 != 0x200; lVar21 = lVar21 + 1) {
    fVar51 = -1.0;
    if ((pIVar12->IO).KeysDown[lVar21] == true) {
      fVar51 = 0.0;
      if (0.0 <= pfVar2[lVar21]) {
        fVar51 = pfVar2[lVar21] + fVar41;
      }
    }
    pfVar2[lVar21] = fVar51;
  }
  local_38 = pIVar12;
  (GImGui->IO).WantSetMousePos = false;
  pIVar34->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar34->NavWrapRequestFlags = 0;
  uVar39 = (pIVar34->IO).ConfigFlags;
  if (((uVar39 & 2) == 0) || (((pIVar34->IO).BackendFlags & 1) == 0)) {
    bVar33 = 0;
  }
  else if (((0.0 < (pIVar34->IO).NavInputs[0]) || (0.0 < (pIVar34->IO).NavInputs[2])) ||
          ((0.0 < (pIVar34->IO).NavInputs[1] || (bVar33 = 1, 0.0 < (pIVar34->IO).NavInputs[3])))) {
    pIVar34->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar33 = 1;
  }
  if ((uVar39 & 1) != 0) {
    bVar14 = IsKeyDown((pIVar34->IO).KeyMap[0xc]);
    if (bVar14) {
      (pIVar34->IO).NavInputs[0] = 1.0;
      pIVar34->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar34->IO).KeyMap[0xd]);
    if (bVar14) {
      (pIVar34->IO).NavInputs[2] = 1.0;
      pIVar34->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar34->IO).KeyMap[0xe]);
    if (bVar14) {
      (pIVar34->IO).NavInputs[1] = 1.0;
      pIVar34->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar34->IO).KeyMap[1]);
    if (bVar14) {
      (pIVar34->IO).NavInputs[0x11] = 1.0;
      pIVar34->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar34->IO).KeyMap[2]);
    if (bVar14) {
      (pIVar34->IO).NavInputs[0x12] = 1.0;
      pIVar34->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar34->IO).KeyMap[3]);
    if (bVar14) {
      (pIVar34->IO).NavInputs[0x13] = 1.0;
      pIVar34->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar34->IO).KeyMap[4]);
    if (bVar14) {
      (pIVar34->IO).NavInputs[0x14] = 1.0;
      pIVar34->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = (pIVar34->IO).KeyCtrl;
    if (bVar14 == true) {
      (pIVar34->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar34->IO).KeyShift == true) {
      (pIVar34->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar14 == false) && ((pIVar34->IO).KeyAlt != false)) {
      (pIVar34->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar2 = (pIVar34->IO).NavInputsDownDuration;
  pfVar30 = pfVar2;
  pfVar32 = (pIVar34->IO).NavInputsDownDurationPrev;
  for (lVar21 = 0x15; lVar21 != 0; lVar21 = lVar21 + -1) {
    *pfVar32 = *pfVar30;
    pfVar30 = pfVar30 + (ulong)bVar38 * -2 + 1;
    pfVar32 = pfVar32 + (ulong)bVar38 * -2 + 1;
  }
  for (lVar21 = 0; lVar21 != 0x15; lVar21 = lVar21 + 1) {
    fVar41 = -1.0;
    if (0.0 < (pIVar34->IO).NavInputs[lVar21]) {
      fVar41 = 0.0;
      if (0.0 <= pfVar2[lVar21]) {
        fVar41 = pfVar2[lVar21] + (pIVar34->IO).DeltaTime;
      }
    }
    pfVar2[lVar21] = fVar41;
  }
  IVar26 = pIVar34->NavInitResultId;
  if ((IVar26 != 0) &&
     (((pIVar34->NavDisableHighlight != true || (pIVar34->NavInitRequestFromMove == true)) &&
      (pIVar34->NavWindow != (ImGuiWindow *)0x0)))) {
    if (pIVar34->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(IVar26,pIVar34->NavLayer,0,&pIVar34->NavInitResultRectRel);
    }
    else {
      SetNavID(IVar26,pIVar34->NavLayer,0);
    }
    IVar43 = (pIVar34->NavInitResultRectRel).Max;
    pIVar6 = &pIVar34->NavWindow->NavRectRel[pIVar34->NavLayer].Min;
    *pIVar6 = (pIVar34->NavInitResultRectRel).Min;
    pIVar6[1] = IVar43;
  }
  pIVar34->NavInitRequest = false;
  pIVar34->NavInitRequestFromMove = false;
  pIVar34->NavInitResultId = 0;
  pIVar34->NavJustMovedToId = 0;
  pIVar12 = GImGui;
  if (pIVar34->NavMoveRequest == true) {
    IVar26 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar26 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar12->NavDisableHighlight = false;
        pIVar12->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar3 = &GImGui->NavMoveResultOther;
      pIVar29 = &GImGui->NavMoveResultLocal;
      if (IVar26 == 0) {
        pIVar29 = pIVar3;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar26 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar26 != 0)) &&
         (IVar26 != GImGui->NavId)) {
        pIVar29 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar29 == pIVar3) {
LAB_0014b6aa:
        pIVar29 = pIVar3;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar41 = (GImGui->NavMoveResultOther).DistBox;
        fVar51 = pIVar29->DistBox;
        if (fVar51 <= fVar41) {
          if (((fVar41 != fVar51) || (NAN(fVar41) || NAN(fVar51))) ||
             (pfVar2 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar29->DistCenter < *pfVar2 || pIVar29->DistCenter == *pfVar2)) goto LAB_0014b6ad;
        }
        goto LAB_0014b6aa;
      }
LAB_0014b6ad:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar22 = pIVar29->Window, pIVar22 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                      ,0x222d,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar43 = (pIVar29->RectRel).Min;
          IVar45 = (pIVar29->RectRel).Max;
          fVar41 = (pIVar22->Pos).x;
          fVar51 = (pIVar22->Pos).y;
          local_48.Max.x = IVar45.x + fVar41;
          local_48.Max.y = IVar45.y + fVar51;
          local_48.Min.y = IVar43.y + fVar51;
          local_48.Min.x = IVar43.x + fVar41;
          IVar43 = ScrollToBringRectIntoView(pIVar29->Window,&local_48);
        }
        else {
          fVar41 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar41 = (pIVar22->ScrollMax).y;
          }
          IVar43 = (ImVec2)((ulong)(uint)((pIVar22->Scroll).y - fVar41) << 0x20);
          (pIVar22->ScrollTarget).y = fVar41;
          (pIVar22->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar41 = (pIVar29->RectRel).Min.y;
        fVar51 = (pIVar29->RectRel).Max.x;
        fVar52 = (pIVar29->RectRel).Max.y;
        (pIVar29->RectRel).Min.x = (pIVar29->RectRel).Min.x - IVar43.x;
        (pIVar29->RectRel).Min.y = fVar41 - IVar43.y;
        (pIVar29->RectRel).Max.x = fVar51 - IVar43.x;
        (pIVar29->RectRel).Max.y = fVar52 - IVar43.y;
      }
      ClearActiveID();
      pIVar12->NavWindow = pIVar29->Window;
      IVar26 = pIVar29->ID;
      if (pIVar12->NavId == IVar26) {
        IVar16 = pIVar29->FocusScopeId;
      }
      else {
        pIVar12->NavJustMovedToId = IVar26;
        IVar16 = pIVar29->FocusScopeId;
        pIVar12->NavJustMovedToFocusScopeId = IVar16;
        pIVar12->NavJustMovedToKeyMods = pIVar12->NavMoveRequestKeyMods;
      }
      SetNavIDWithRectRel(IVar26,pIVar12->NavLayer,IVar16,&pIVar29->RectRel);
      pIVar12->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar34->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar34->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x2137,"void ImGui::NavUpdate()");
    }
    if (((pIVar34->NavMoveResultLocal).ID == 0) && ((pIVar34->NavMoveResultOther).ID == 0)) {
      pIVar34->NavDisableHighlight = false;
    }
    pIVar34->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar34->NavMousePosDirty == true) && (pIVar34->NavIdIsAlive == true)) {
    if ((((pIVar34->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar34->IO).BackendFlags & 4) != 0 && (pIVar34->NavDisableHighlight == false)) &&
         (pIVar34->NavDisableMouseHover == true)) && (pIVar34->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar43 = NavCalcPreferredRefPos();
      (pIVar34->IO).MousePosPrev = IVar43;
      (pIVar34->IO).MousePos = IVar43;
      (pIVar34->IO).WantSetMousePos = true;
    }
    pIVar34->NavMousePosDirty = false;
  }
  pIVar34->NavIdIsAlive = false;
  pIVar34->NavJustTabbedId = 0;
  IVar31 = pIVar34->NavLayer;
  if (ImGuiNavLayer_Menu < IVar31) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x214d,"void ImGui::NavUpdate()");
  }
  pIVar22 = pIVar34->NavWindow;
  pIVar28 = pIVar22;
  if (pIVar22 != (ImGuiWindow *)0x0) {
    for (; pIVar28 != (ImGuiWindow *)0x0; pIVar28 = pIVar28->ParentWindow) {
      if ((pIVar28->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar28 != pIVar22) {
          pIVar28->NavLastChildNavWindow = pIVar22;
        }
        break;
      }
    }
    if ((IVar31 == ImGuiNavLayer_Main) && (pIVar22->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar22->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar12 = GImGui;
  pIVar22 = GetTopMostPopupModal();
  if (pIVar22 == (ImGuiWindow *)0x0) {
    if (pIVar12->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0014b93d;
LAB_0014b944:
      bVar14 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
      if (((pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar12->IO).KeyCtrl == true))
         && (bVar36 = IsKeyPressedMap(0,true), bVar36)) {
        bVar38 = (byte)(pIVar12->IO).ConfigFlags;
        uVar40 = (uint)bVar38;
        if (bVar14 || (bVar38 & 1) != 0) {
LAB_0014b98a:
          pIVar22 = pIVar12->NavWindow;
          if ((pIVar22 != (ImGuiWindow *)0x0) ||
             (pIVar22 = FindWindowNavFocusable
                                  ((pIVar12->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar22 != (ImGuiWindow *)0x0)) {
            pIVar22 = pIVar22->RootWindow;
            pIVar12->NavWindowingTargetAnim = pIVar22;
            pIVar12->NavWindowingTarget = pIVar22;
            pIVar12->NavWindowingTimer = 0.0;
            pIVar12->NavWindowingHighlightAlpha = 0.0;
            pIVar12->NavWindowingToggleLayer = (bool)(~(byte)uVar40 & 1);
            pIVar12->NavInputSource = ImGuiInputSource_NavGamepad - (uVar40 & 1);
          }
        }
      }
      else if (bVar14) {
        uVar40 = 0;
        goto LAB_0014b98a;
      }
      bVar14 = pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0) {
        fVar41 = (pIVar12->IO).DeltaTime * -10.0 + pIVar12->NavWindowingHighlightAlpha;
        fVar41 = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
        pIVar12->NavWindowingHighlightAlpha = fVar41;
        if ((pIVar12->DimBgRatio <= 0.0) && (fVar41 <= 0.0)) {
          pIVar12->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
        goto LAB_0014b944;
      }
LAB_0014b93d:
      bVar14 = false;
    }
    fVar41 = (pIVar12->IO).DeltaTime + pIVar12->NavWindowingTimer;
    pIVar12->NavWindowingTimer = fVar41;
    if (bVar14) {
LAB_0014bb76:
      bVar14 = false;
      pIVar22 = (ImGuiWindow *)0x0;
    }
    else {
      IVar18 = pIVar12->NavInputSource;
      if (IVar18 != ImGuiInputSource_NavGamepad) {
LAB_0014bae9:
        if (IVar18 == ImGuiInputSource_NavKeyboard) {
          fVar51 = (pIVar12->NavWindowingTimer + -0.2) / 0.05;
          fVar41 = 1.0;
          if (fVar51 <= 1.0) {
            fVar41 = fVar51;
          }
          fVar41 = (float)(~-(uint)(fVar51 < 0.0) & (uint)fVar41);
          uVar40 = -(uint)(fVar41 <= pIVar12->NavWindowingHighlightAlpha);
          pIVar12->NavWindowingHighlightAlpha =
               (float)(uVar40 & (uint)pIVar12->NavWindowingHighlightAlpha | ~uVar40 & (uint)fVar41);
          bVar14 = IsKeyPressedMap(0,true);
          if (bVar14) {
            NavUpdateWindowingHighlightWindow((pIVar12->IO).KeyShift - 1 | 1);
          }
          if ((pIVar12->IO).KeyCtrl == false) {
            pIVar22 = pIVar12->NavWindowingTarget;
            bVar14 = false;
            goto LAB_0014bb81;
          }
        }
        goto LAB_0014bb76;
      }
      fVar51 = (fVar41 + -0.2) / 0.05;
      fVar41 = 1.0;
      if (fVar51 <= 1.0) {
        fVar41 = fVar51;
      }
      fVar41 = (float)(~-(uint)(fVar51 < 0.0) & (uint)fVar41);
      uVar40 = -(uint)(fVar41 <= pIVar12->NavWindowingHighlightAlpha);
      pIVar12->NavWindowingHighlightAlpha =
           (float)(uVar40 & (uint)pIVar12->NavWindowingHighlightAlpha | ~uVar40 & (uint)fVar41);
      bVar14 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
      bVar36 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
      if ((uint)bVar14 - (uint)bVar36 != 0) {
        NavUpdateWindowingHighlightWindow((uint)bVar14 - (uint)bVar36);
        pIVar12->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) {
        if (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0014bb76;
        IVar18 = pIVar12->NavInputSource;
        goto LAB_0014bae9;
      }
      pbVar35 = &pIVar12->NavWindowingToggleLayer;
      *pbVar35 = (bool)(*pbVar35 &
                       (pIVar12->NavWindowingHighlightAlpha <= 1.0 &&
                       pIVar12->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar35 == false) {
        pIVar22 = pIVar12->NavWindowingTarget;
        bVar14 = false;
      }
      else {
        bVar14 = pIVar12->NavWindow != (ImGuiWindow *)0x0;
        pIVar22 = (ImGuiWindow *)0x0;
      }
      pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_0014bb81:
    dir_sources = 1;
    bVar36 = IsNavInputTest(0x10,ImGuiInputReadMode_Pressed);
    if (bVar36) {
      pIVar12->NavWindowingToggleLayer = true;
    }
    if (((pIVar12->ActiveId == 0) || (pIVar12->ActiveIdAllowOverlap == true)) &&
       ((pIVar12->NavWindowingToggleLayer == true &&
        (bVar36 = IsNavInputTest(0x10,ImGuiInputReadMode_Released), bVar36)))) {
      bVar36 = IsMousePosValid(&(pIVar12->IO).MousePos);
      bVar37 = IsMousePosValid(&(pIVar12->IO).MousePosPrev);
      bVar14 = (bool)(bVar37 == bVar36 | bVar14);
    }
    pIVar28 = pIVar12->NavWindowingTarget;
    if ((pIVar28 != (ImGuiWindow *)0x0) && ((pIVar28->Flags & 4) == 0)) {
      if (pIVar12->NavInputSource == ImGuiInputSource_NavGamepad) {
        dir_sources = 4;
LAB_0014bc87:
        IVar43 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
      }
      else {
        IVar43.x = 0.0;
        IVar43.y = 0.0;
        if ((pIVar12->NavInputSource == ImGuiInputSource_NavKeyboard) &&
           ((pIVar12->IO).KeyShift == false)) goto LAB_0014bc87;
      }
      fVar41 = IVar43.x;
      fVar51 = IVar43.y;
      if ((((fVar41 != 0.0) || (NAN(fVar41))) || (fVar51 != 0.0)) || (NAN(fVar51))) {
        fVar52 = (pIVar12->IO).DisplayFramebufferScale.x;
        fVar42 = (pIVar12->IO).DisplayFramebufferScale.y;
        if (fVar42 <= fVar52) {
          fVar52 = fVar42;
        }
        fVar52 = (float)(int)(fVar52 * (pIVar12->IO).DeltaTime * 800.0);
        IVar43 = pIVar28->RootWindow->Pos;
        local_48.Min.y = IVar43.y + fVar51 * fVar52;
        local_48.Min.x = IVar43.x + fVar41 * fVar52;
        SetWindowPos(pIVar28->RootWindow,&local_48.Min,1);
        pIVar12->NavDisableMouseHover = true;
        MarkIniSettingsDirty(pIVar12->NavWindowingTarget);
      }
    }
    if (pIVar22 != (ImGuiWindow *)0x0) {
      if ((pIVar12->NavWindow == (ImGuiWindow *)0x0) || (pIVar22 != pIVar12->NavWindow->RootWindow))
      {
        ClearActiveID();
        pIVar12->NavDisableHighlight = false;
        pIVar12->NavDisableMouseHover = true;
        pIVar28 = pIVar22->NavLastChildNavWindow;
        if (pIVar22->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar28 = pIVar22;
        }
        ClosePopupsOverWindow(pIVar28,false);
        FocusWindow(pIVar28);
        if (pIVar28->NavLastIds[0] == 0) {
          NavInitWindow(pIVar28,false);
        }
        if ((pIVar28->DC).NavLayerActiveMask == 2) {
          pIVar12->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar14) && (pIVar22 = pIVar12->NavWindow, pIVar28 = pIVar22, pIVar22 != (ImGuiWindow *)0x0)
       ) {
      while (window = pIVar28, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar28 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar22) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar22;
        pIVar22 = pIVar12->NavWindow;
      }
      pIVar12->NavDisableHighlight = false;
      pIVar12->NavDisableMouseHover = true;
      IVar31 = ImGuiNavLayer_Main;
      if (((pIVar22->DC).NavLayerActiveMask & 2) != 0) {
        IVar31 = pIVar12->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar31);
    }
  }
  else {
    pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar39 & 1) == 0 & (bVar33 ^ 1))) || (pIVar34->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar34->IO).NavActive = false;
LAB_0014be60:
    bVar14 = pIVar34->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar14 = (pIVar34->NavWindow->Flags & 0x40000U) == 0;
    (pIVar34->IO).NavActive = bVar14;
    if (((!bVar14) || (pIVar34->NavId == 0)) ||
       (bVar14 = true, pIVar34->NavDisableHighlight != false)) goto LAB_0014be60;
  }
  (pIVar34->IO).NavVisible = bVar14;
  bVar14 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar14) {
    if (pIVar34->ActiveId == 0) {
      pIVar22 = pIVar34->NavWindow;
      if (((pIVar22 == (ImGuiWindow *)0x0) || ((pIVar22->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar22->ParentWindow == (ImGuiWindow *)0x0)) {
        if ((pIVar34->OpenPopupStack).Size < 1) {
          if (pIVar34->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x5000000U) != 0x1000000)) {
              pIVar22->NavLastIds[0] = 0;
            }
            pIVar34->NavId = 0;
            pIVar34->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else {
          pIVar23 = ImVector<ImGuiPopupData>::back(&pIVar34->OpenPopupStack);
          if ((pIVar23->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar34->OpenPopupStack).Size + -1,true);
          }
        }
      }
      else {
        if (pIVar22->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                        ,0x2169,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar22->ParentWindow);
        SetNavID(pIVar22->ChildId,0,0);
        pIVar34->NavIdIsAlive = false;
        if (pIVar34->NavDisableMouseHover == true) {
          pIVar34->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar34->NavActivateId = 0;
  pIVar34->NavActivateDownId = 0;
  pIVar34->NavActivatePressedId = 0;
  pIVar34->NavInputId = 0;
  if (((pIVar34->NavId == 0) || (pIVar34->NavDisableHighlight != false)) ||
     (pIVar34->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_0014bfe9:
    pIVar22 = pIVar34->NavWindow;
    if (pIVar22 == (ImGuiWindow *)0x0) goto LAB_0014c052;
    if ((pIVar22->Flags & 0x40000) != 0) {
      pIVar34->NavDisableHighlight = true;
    }
    bVar14 = false;
  }
  else {
    if (pIVar34->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar34->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar14 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
          IVar26 = pIVar34->ActiveId;
          IVar16 = pIVar34->NavId;
          if (IVar26 == 0 && bVar14) {
            pIVar34->NavActivateId = IVar16;
            pIVar34->NavActivateDownId = IVar16;
LAB_0014c410:
            pIVar34->NavActivatePressedId = IVar16;
          }
          else if (IVar26 == 0) {
            pIVar34->NavActivateDownId = IVar16;
            if (bVar14) goto LAB_0014c410;
          }
          else {
            bVar36 = IVar26 == IVar16;
            if (!bVar36) goto LAB_0014bfe9;
            pIVar34->NavActivateDownId = IVar26;
            IVar16 = IVar26;
            if (bVar14 && bVar36) goto LAB_0014c410;
          }
LAB_0014c418:
          bVar14 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
          if (bVar14) {
            pIVar34->NavInputId = pIVar34->NavId;
          }
        }
        else if (pIVar34->ActiveId == pIVar34->NavId || pIVar34->ActiveId == 0) goto LAB_0014c418;
      }
      goto LAB_0014bfe9;
    }
LAB_0014c052:
    bVar14 = true;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  IVar26 = pIVar34->NavActivateId;
  if ((IVar26 != 0) && (pIVar34->NavActivateDownId != IVar26)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x2197,"void ImGui::NavUpdate()");
  }
  pIVar34->NavMoveRequest = false;
  IVar26 = pIVar34->NavNextActivateId;
  if (IVar26 != 0) {
    pIVar34->NavActivateId = IVar26;
    pIVar34->NavActivateDownId = IVar26;
    pIVar34->NavActivatePressedId = IVar26;
    pIVar34->NavInputId = IVar26;
  }
  pIVar34->NavNextActivateId = 0;
  if (pIVar34->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar34->NavMoveDir = -1;
    pIVar34->NavMoveRequestFlags = 0;
    if (((!bVar14) && (pIVar34->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar22->Flags & 0x40000) == 0)) {
      if (((GImGui->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar14 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar34->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar14 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar34->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar14 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar34->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar14 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x14,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar34->NavMoveDir = 3;
      }
    }
    pIVar34->NavMoveClipDir = pIVar34->NavMoveDir;
  }
  else {
    if ((pIVar34->NavMoveDir == -1) || (pIVar34->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x21b2,"void ImGui::NavUpdate()");
    }
    if (pIVar34->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x21b3,"void ImGui::NavUpdate()");
    }
    pIVar34->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar12 = GImGui;
  fVar41 = 0.0;
  if ((((((uVar39 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar22 = GImGui->NavWindow, pIVar22 != (ImGuiWindow *)0x0)) &&
      (((pIVar22->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar14 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar37 = false;
    bVar36 = false;
    if (bVar14) {
      bVar36 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[6]);
    if (bVar14) {
      bVar37 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar14 = IsKeyPressed((pIVar12->IO).KeyMap[7],true);
    if (bVar14) {
      bVar14 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar14 = false;
    }
    bVar15 = IsKeyPressed((pIVar12->IO).KeyMap[8],true);
    if (bVar15) {
      bVar15 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar15 = false;
    }
    fVar41 = 0.0;
    if ((bVar36 != bVar37) || (bVar14 != bVar15)) {
      if (((pIVar22->DC).NavLayerActiveMask == 0) && ((pIVar22->DC).NavHasScroll == true)) {
        bVar36 = IsKeyPressed((pIVar12->IO).KeyMap[5],true);
        if (bVar36) {
          fVar41 = (pIVar22->Scroll).y - ((pIVar22->InnerRect).Max.y - (pIVar22->InnerRect).Min.y);
LAB_0014d413:
          (pIVar22->ScrollTarget).y = fVar41;
        }
        else {
          bVar36 = IsKeyPressed((pIVar12->IO).KeyMap[6],true);
          if (bVar36) {
            fVar41 = ((pIVar22->InnerRect).Max.y - (pIVar22->InnerRect).Min.y) + (pIVar22->Scroll).y
            ;
            goto LAB_0014d413;
          }
          if (bVar14 == false) {
            if (bVar15 == false) goto LAB_0014d41c;
            fVar41 = (pIVar22->ScrollMax).y;
            goto LAB_0014d413;
          }
          (pIVar22->ScrollTarget).y = 0.0;
        }
        (pIVar22->ScrollTargetCenterRatio).y = 0.0;
LAB_0014d41c:
        fVar41 = 0.0;
      }
      else {
        IVar31 = pIVar12->NavLayer;
        fVar41 = (pIVar22->InnerRect).Max.y;
        fVar51 = (pIVar22->InnerRect).Min.y;
        fVar52 = ImGuiWindow::CalcFontSize(pIVar22);
        fVar41 = (pIVar22->NavRectRel[IVar31].Max.y - pIVar22->NavRectRel[IVar31].Min.y) +
                 ((fVar41 - fVar51) - fVar52);
        fVar41 = (float)(~-(uint)(fVar41 <= 0.0) & (uint)fVar41);
        bVar36 = IsKeyPressed((pIVar12->IO).KeyMap[5],true);
        if (bVar36) {
          fVar41 = -fVar41;
          pIVar12->NavMoveDir = 3;
          pIVar12->NavMoveClipDir = 2;
          pIVar12->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar36 = IsKeyPressed((pIVar12->IO).KeyMap[6],true);
          if (!bVar36) {
            pIVar25 = pIVar22->NavRectRel + IVar31;
            if (bVar14 == false) {
              fVar41 = 0.0;
              if (bVar15 != false) {
                fVar51 = ((pIVar22->ScrollMax).y + (pIVar22->SizeFull).y) - (pIVar22->Scroll).y;
                pIVar22->NavRectRel[IVar31].Max.y = fVar51;
                pIVar22->NavRectRel[IVar31].Min.y = fVar51;
                fVar51 = (pIVar25->Min).x;
                pIVar6 = &pIVar22->NavRectRel[IVar31].Max;
                if (pIVar6->x <= fVar51 && fVar51 != pIVar6->x) {
                  pIVar22->NavRectRel[IVar31].Max.x = 0.0;
                  (pIVar25->Min).x = 0.0;
                }
                pIVar12->NavMoveDir = 2;
                pIVar12->NavMoveRequestFlags = 0x50;
              }
              goto LAB_0014c21f;
            }
            fVar41 = -(pIVar22->Scroll).y;
            pIVar22->NavRectRel[IVar31].Max.y = fVar41;
            pIVar22->NavRectRel[IVar31].Min.y = fVar41;
            fVar41 = (pIVar25->Min).x;
            pIVar6 = &pIVar22->NavRectRel[IVar31].Max;
            if (pIVar6->x <= fVar41 && fVar41 != pIVar6->x) {
              pIVar22->NavRectRel[IVar31].Max.x = 0.0;
              (pIVar25->Min).x = 0.0;
            }
            pIVar12->NavMoveDir = 3;
            pIVar12->NavMoveRequestFlags = 0x50;
            goto LAB_0014d41c;
          }
          pIVar12->NavMoveDir = 2;
          pIVar12->NavMoveClipDir = 3;
          pIVar12->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_0014c21f:
  if (pIVar34->NavMoveDir == -1) {
    if ((pIVar34->NavMoveRequest & 1U) != 0) goto LAB_0014c25e;
  }
  else {
    pIVar34->NavMoveRequest = true;
    pIVar34->NavMoveRequestKeyMods = (pIVar34->IO).KeyMods;
    pIVar34->NavMoveDirLast = pIVar34->NavMoveDir;
LAB_0014c25e:
    if (pIVar34->NavId == 0) {
      pIVar34->NavInitRequest = true;
      pIVar34->NavInitRequestFromMove = true;
      pIVar34->NavInitResultId = 0;
      pIVar34->NavDisableHighlight = false;
    }
  }
  NavUpdateAnyRequestFlag();
  pIVar22 = pIVar34->NavWindow;
  if (((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x40000) == 0)) &&
     (pIVar34->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar51 = ImGuiWindow::CalcFontSize(pIVar22);
    fVar51 = (float)(int)(fVar51 * 100.0 * (pIVar34->IO).DeltaTime + 0.5);
    if ((((pIVar22->DC).NavLayerActiveMask == 0) && ((pIVar22->DC).NavHasScroll == true)) &&
       (pIVar34->NavMoveRequest == true)) {
      uVar39 = pIVar34->NavMoveDir;
      if (uVar39 < 2) {
        lVar21 = 0x6c;
        lVar27 = 100;
        uVar40 = 0;
        lStack_70 = 0x54;
      }
      else {
        if ((uVar39 & 0xfffffffe) != 2) goto LAB_0014c4a6;
        uVar40 = 2;
        lVar21 = 0x70;
        lVar27 = 0x68;
        lStack_70 = 0x58;
      }
      *(float *)((long)&pIVar22->Name + lVar27) =
           (float)(int)(*(float *)(&DAT_0018b0d8 + (ulong)(uVar39 == uVar40) * 4) * fVar51 +
                       *(float *)((long)&pIVar22->Name + lStack_70));
      *(undefined4 *)((long)&pIVar22->Name + lVar21) = 0;
    }
LAB_0014c4a6:
    IVar43 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar52 = IVar43.x;
    fVar42 = IVar43.y;
    if (((fVar52 != 0.0) || (NAN(fVar52))) && (pIVar22->ScrollbarX == true)) {
      (pIVar22->ScrollTarget).x = (float)(int)(fVar52 * fVar51 + (pIVar22->Scroll).x);
      (pIVar22->ScrollTargetCenterRatio).x = 0.0;
      pIVar34->NavMoveFromClampedRefRect = true;
    }
    if ((fVar42 != 0.0) || (NAN(fVar42))) {
      (pIVar22->ScrollTarget).y = (float)(int)(fVar42 * fVar51 + (pIVar22->Scroll).y);
      (pIVar22->ScrollTargetCenterRatio).y = 0.0;
      pIVar34->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar34->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar34->NavMoveResultLocal).ID = 0;
  (pIVar34->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar34->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar34->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar34->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar34->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar34->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar34->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar34->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar34->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar34->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar34->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar34->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar34->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar34->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar34->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar34->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar34->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar34->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar34->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar34->NavMoveResultOther).ID = 0;
  (pIVar34->NavMoveResultOther).FocusScopeId = 0;
  (pIVar34->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar34->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar34->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar34->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar34->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar34->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar34->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((pIVar34->NavMoveRequest == true) && (pIVar34->NavMoveFromClampedRefRect == true)) &&
     (pIVar34->NavLayer == ImGuiNavLayer_Main)) {
    pIVar22 = pIVar34->NavWindow;
    IVar43 = (pIVar22->InnerRect).Min;
    fVar51 = (pIVar22->Pos).x;
    fVar52 = (pIVar22->Pos).y;
    IVar45 = (pIVar22->InnerRect).Max;
    local_48.Max.x = (IVar45.x - fVar51) + 1.0;
    local_48.Max.y = (IVar45.y - fVar52) + 1.0;
    local_48.Min.y = (IVar43.y - fVar52) + -1.0;
    local_48.Min.x = (IVar43.x - fVar51) + -1.0;
    bVar14 = ImRect::Contains(&local_48,pIVar22->NavRectRel);
    if (!bVar14) {
      fVar51 = ImGuiWindow::CalcFontSize(pIVar22);
      auVar54._0_4_ = fVar51 * 0.5;
      auVar53._0_4_ = local_48.Max.x - local_48.Min.x;
      auVar53._4_4_ = local_48.Max.y - local_48.Min.y;
      auVar53._8_4_ = local_48.Max.x - local_48.Max.x;
      auVar53._12_4_ = local_48.Max.y - local_48.Max.y;
      auVar54._4_4_ = auVar54._0_4_;
      auVar54._8_4_ = auVar54._0_4_;
      auVar54._12_4_ = auVar54._0_4_;
      auVar54 = minps(auVar53,auVar54);
      local_48.Max.x = local_48.Max.x - auVar54._0_4_;
      local_48.Max.y = local_48.Max.y - auVar54._4_4_;
      local_48.Min.y = auVar54._4_4_ + local_48.Min.y;
      local_48.Min.x = auVar54._0_4_ + local_48.Min.x;
      ImRect::ClipWith(pIVar22->NavRectRel + pIVar34->NavLayer,&local_48);
      pIVar34->NavId = 0;
      pIVar34->NavFocusScopeId = 0;
    }
    pIVar34->NavMoveFromClampedRefRect = false;
  }
  pIVar22 = pIVar34->NavWindow;
  if (pIVar22 == (ImGuiWindow *)0x0) {
    IVar45 = (GImGui->IO).DisplaySize;
    fVar51 = 0.0;
    fVar52 = 0.0;
  }
  else {
    IVar43 = pIVar22->NavRectRel[pIVar34->NavLayer].Min;
    IVar45 = pIVar22->NavRectRel[pIVar34->NavLayer].Max;
    fVar42 = IVar43.x;
    fVar57 = IVar43.y;
    IVar44.x = 0.0;
    IVar44.y = 0.0;
    fVar51 = 0.0;
    fVar52 = 0.0;
    if (fVar57 <= IVar45.y && fVar42 <= IVar45.x) {
      fVar51 = fVar42;
      fVar52 = fVar57;
      IVar44 = IVar45;
    }
    fVar42 = (pIVar22->Pos).x;
    fVar51 = fVar51 + fVar42;
    fVar57 = (pIVar22->Pos).y;
    fVar52 = fVar52 + fVar57;
    IVar45.x = IVar44.x + fVar42;
    IVar45.y = IVar44.y + fVar57;
  }
  (pIVar34->NavScoringRect).Min.y = fVar52 + fVar41;
  fVar57 = IVar45.y + fVar41;
  (pIVar34->NavScoringRect).Max.y = fVar57;
  fVar42 = fVar51 + 1.0;
  if (IVar45.x <= fVar51 + 1.0) {
    fVar42 = IVar45.x;
  }
  (pIVar34->NavScoringRect).Min.x = fVar42;
  (pIVar34->NavScoringRect).Max.x = fVar42;
  if (fVar57 < fVar52 + fVar41) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x2205,"void ImGui::NavUpdate()");
  }
  pIVar34->NavScoringCount = 0;
  pIVar12 = GImGui;
  pIVar6 = &(GImGui->IO).MousePos;
  bVar14 = IsMousePosValid(pIVar6);
  if (bVar14) {
    IVar43 = (pIVar12->IO).MousePos;
    IVar46.x = (float)(int)IVar43.x;
    IVar46.y = (float)(int)IVar43.y;
    pIVar12->LastValidMousePos = IVar46;
    (pIVar12->IO).MousePos = IVar46;
  }
  bVar14 = IsMousePosValid(pIVar6);
  if ((bVar14) && (bVar14 = IsMousePosValid(&(pIVar12->IO).MousePosPrev), bVar14)) {
    IVar43 = (pIVar12->IO).MousePos;
    IVar45 = (pIVar12->IO).MousePosPrev;
    IVar47.x = IVar43.x - IVar45.x;
    IVar47.y = IVar43.y - IVar45.y;
    (pIVar12->IO).MouseDelta = IVar47;
    if (((IVar47.x != 0.0) || (NAN(IVar47.x))) || ((IVar47.y != 0.0 || (NAN(IVar47.y))))) {
      pIVar12->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar12->IO).MouseDelta.x = 0.0;
    (pIVar12->IO).MouseDelta.y = 0.0;
  }
  (pIVar12->IO).MousePosPrev = (pIVar12->IO).MousePos;
  for (lVar21 = 0; lVar21 != 5; lVar21 = lVar21 + 1) {
    if ((pIVar12->IO).MouseDown[lVar21] == true) {
      fVar41 = (pIVar12->IO).MouseDownDuration[lVar21];
      pbVar35 = (pIVar12->IO).MouseClicked + lVar21;
      *pbVar35 = fVar41 < 0.0;
      pbVar35[10] = false;
      (pIVar12->IO).MouseDownDurationPrev[lVar21] = fVar41;
      if (0.0 <= fVar41) {
        (pIVar12->IO).MouseDownDuration[lVar21] = fVar41 + (pIVar12->IO).DeltaTime;
        (pIVar12->IO).MouseDoubleClicked[lVar21] = false;
        bVar14 = IsMousePosValid(pIVar6);
        auVar50 = ZEXT816(0);
        if (bVar14) {
          IVar43 = (pIVar12->IO).MousePos;
          IVar45 = (pIVar12->IO).MouseClickedPos[lVar21];
          auVar50._0_4_ = IVar43.x - IVar45.x;
          auVar50._4_4_ = IVar43.y - IVar45.y;
          auVar50._8_8_ = 0;
        }
        fVar41 = (pIVar12->IO).MouseDragMaxDistanceSqr[lVar21];
        fVar51 = auVar50._0_4_ * auVar50._0_4_ + auVar50._4_4_ * auVar50._4_4_;
        uVar39 = -(uint)(fVar51 <= fVar41);
        (pIVar12->IO).MouseDragMaxDistanceSqr[lVar21] =
             (float)(~uVar39 & (uint)fVar51 | (uint)fVar41 & uVar39);
        IVar43 = (pIVar12->IO).MouseDragMaxDistanceAbs[lVar21];
        fVar41 = IVar43.x;
        fVar51 = IVar43.y;
        auVar55._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
        auVar55._8_4_ = auVar50._8_4_ ^ 0x80000000;
        auVar55._12_4_ = auVar50._12_4_ ^ 0x80000000;
        auVar54 = maxps(auVar55,auVar50);
        uVar39 = -(uint)(auVar54._0_4_ <= fVar41);
        uVar40 = -(uint)(auVar54._4_4_ <= fVar51);
        (pIVar12->IO).MouseDragMaxDistanceAbs[lVar21] =
             (ImVec2)(CONCAT44(~uVar40 & (uint)auVar54._4_4_,~uVar39 & (uint)auVar54._0_4_) |
                     CONCAT44((uint)fVar51 & uVar40,(uint)fVar41 & uVar39));
      }
      else {
        (pIVar12->IO).MouseDownDuration[lVar21] = 0.0;
        (pIVar12->IO).MouseDoubleClicked[lVar21] = false;
        dVar48 = pIVar12->Time;
        if ((float)(dVar48 - (pIVar12->IO).MouseClickedTime[lVar21]) <
            (pIVar12->IO).MouseDoubleClickTime) {
          bVar14 = IsMousePosValid(pIVar6);
          fVar41 = 0.0;
          fVar51 = 0.0;
          if (bVar14) {
            IVar43 = (pIVar12->IO).MousePos;
            IVar45 = (pIVar12->IO).MouseClickedPos[lVar21];
            fVar41 = IVar43.x - IVar45.x;
            fVar51 = IVar43.y - IVar45.y;
          }
          fVar52 = (pIVar12->IO).MouseDoubleClickMaxDist;
          dVar48 = -1.79769313486232e+308;
          if (fVar41 * fVar41 + fVar51 * fVar51 < fVar52 * fVar52) {
            (pIVar12->IO).MouseDoubleClicked[lVar21] = true;
            dVar48 = -1.79769313486232e+308;
          }
        }
        (pIVar12->IO).MouseClickedTime[lVar21] = dVar48;
        (pIVar12->IO).MouseClickedPos[lVar21] = (pIVar12->IO).MousePos;
        (pIVar12->IO).MouseDownWasDoubleClick[lVar21] = (pIVar12->IO).MouseDoubleClicked[lVar21];
        pIVar7 = (pIVar12->IO).MouseDragMaxDistanceAbs + lVar21;
        pIVar7->x = 0.0;
        pIVar7->y = 0.0;
        (pIVar12->IO).MouseDragMaxDistanceSqr[lVar21] = 0.0;
      }
    }
    else {
      (pIVar12->IO).MouseClicked[lVar21] = false;
      fVar41 = (pIVar12->IO).MouseDownDuration[lVar21];
      (pIVar12->IO).MouseReleased[lVar21] = 0.0 <= fVar41;
      pbVar35 = (pIVar12->IO).MouseClicked + lVar21;
      (pIVar12->IO).MouseDownDurationPrev[lVar21] = fVar41;
      (pIVar12->IO).MouseDownDuration[lVar21] = -1.0;
      (pIVar12->IO).MouseDoubleClicked[lVar21] = false;
    }
    if (((pIVar12->IO).MouseDown[lVar21] == false) && ((pIVar12->IO).MouseReleased[lVar21] == false)
       ) {
      (pIVar12->IO).MouseDownWasDoubleClick[lVar21] = false;
    }
    if (*pbVar35 == true) {
      pIVar12->NavDisableMouseHover = false;
    }
  }
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar22 = GetTopMostPopupModal();
  pIVar12 = local_38;
  if ((pIVar22 != (ImGuiWindow *)0x0) ||
     ((local_38->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < local_38->NavWindowingHighlightAlpha)))) {
    fVar41 = (local_38->IO).DeltaTime * 6.0 + local_38->DimBgRatio;
    if (1.0 <= fVar41) {
      fVar41 = 1.0;
    }
    local_38->DimBgRatio = fVar41;
  }
  else {
    fVar41 = (local_38->IO).DeltaTime * -10.0 + local_38->DimBgRatio;
    local_38->DimBgRatio = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
  }
  local_38->MouseCursor = 0;
  local_38->WantTextInputNextFrame = -1;
  local_38->WantCaptureMouseNextFrame = -1;
  local_38->WantCaptureKeyboardNextFrame = -1;
  (local_38->PlatformImePos).x = 1.0;
  pIVar34 = GImGui;
  (local_38->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar14 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar14) &&
        (fVar41 = (pIVar34->IO).MouseDragThreshold,
        fVar51 = (pIVar34->IO).MousePos.x - (pIVar34->WheelingWindowRefMousePos).x,
        fVar52 = (pIVar34->IO).MousePos.y - (pIVar34->WheelingWindowRefMousePos).y,
        fVar41 * fVar41 < fVar51 * fVar51 + fVar52 * fVar52)) ||
       (pIVar34->WheelingWindowTimer <= 0.0)) {
      pIVar34->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar34->WheelingWindowTimer = 0.0;
    }
  }
  fVar41 = (pIVar34->IO).MouseWheel;
  if (((((fVar41 != 0.0) || (fVar51 = (pIVar34->IO).MouseWheelH, fVar51 != 0.0)) || (NAN(fVar51)))
      && ((pIVar22 = pIVar34->WheelingWindow, pIVar22 != (ImGuiWindow *)0x0 ||
          (pIVar22 = pIVar34->HoveredWindow, pIVar22 != (ImGuiWindow *)0x0)))) &&
     (pIVar22->Collapsed == false)) {
    if ((fVar41 != 0.0) || (NAN(fVar41))) {
      if ((pIVar34->IO).KeyCtrl == true) {
        if ((pIVar34->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar22);
          fVar41 = pIVar22->FontWindowScale;
          fVar52 = (pIVar34->IO).MouseWheel * 0.1 + fVar41;
          fVar51 = 2.5;
          if (fVar52 <= 2.5) {
            fVar51 = fVar52;
          }
          fVar51 = (float)(-(uint)(fVar52 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar52 < 0.5) & (uint)fVar51);
          pIVar22->FontWindowScale = fVar51;
          if ((pIVar22->Flags & 0x1000000) == 0) {
            fVar51 = fVar51 / fVar41;
            IVar43 = pIVar22->Size;
            IVar45 = (pIVar34->IO).MousePos;
            fVar41 = (pIVar22->Pos).x;
            fVar52 = (pIVar22->Pos).y;
            auVar56._0_4_ = (IVar45.x - fVar41) * (1.0 - fVar51) * IVar43.x;
            auVar56._4_4_ = (IVar45.y - fVar52) * (1.0 - fVar51) * IVar43.y;
            auVar56._8_8_ = 0;
            auVar11._8_8_ = 0;
            auVar11._0_4_ = IVar43.x;
            auVar11._4_4_ = IVar43.y;
            auVar54 = divps(auVar56,auVar11);
            local_48.Min.x = auVar54._0_4_ + fVar41;
            local_48.Min.y = auVar54._4_4_ + fVar52;
            SetWindowPos(pIVar22,&local_48.Min,0);
            IVar49.x = (float)(int)((pIVar22->Size).x * fVar51);
            IVar49.y = (float)(int)((pIVar22->Size).y * fVar51);
            IVar10.y = (float)(int)((pIVar22->SizeFull).y * fVar51);
            IVar10.x = (float)(int)((pIVar22->SizeFull).x * fVar51);
            pIVar22->Size = IVar49;
            pIVar22->SizeFull = IVar10;
          }
          goto LAB_0014cbd8;
        }
      }
      else if ((pIVar34->IO).KeyShift == false) {
        StartLockWheelingWindow(pIVar22);
        while ((uVar39 = pIVar22->Flags, (uVar39 >> 0x18 & 1) != 0 &&
               (((uVar39 & 0x210) == 0x10 ||
                ((fVar51 = (pIVar22->ScrollMax).y, fVar51 == 0.0 && (!NAN(fVar51)))))))) {
          pIVar22 = pIVar22->ParentWindow;
        }
        if ((uVar39 & 0x210) == 0) {
          fVar52 = ((pIVar22->InnerRect).Max.y - (pIVar22->InnerRect).Min.y) * 0.67;
          fVar42 = ImGuiWindow::CalcFontSize(pIVar22);
          fVar51 = fVar42 * 5.0;
          if (fVar52 <= fVar42 * 5.0) {
            fVar51 = fVar52;
          }
          (pIVar22->ScrollTarget).y = (pIVar22->Scroll).y - fVar41 * (float)(int)fVar51;
          (pIVar22->ScrollTargetCenterRatio).y = 0.0;
        }
      }
    }
    fVar41 = (pIVar34->IO).MouseWheelH;
    if (((fVar41 == 0.0) && (!NAN(fVar41))) || ((pIVar34->IO).KeyShift == true)) {
      fVar41 = (pIVar34->IO).MouseWheel;
      if (((fVar41 == 0.0) && (!NAN(fVar41))) || ((pIVar34->IO).KeyShift != true))
      goto LAB_0014cbd8;
    }
    if ((pIVar34->IO).KeyCtrl == false) {
      StartLockWheelingWindow(pIVar22);
      while ((uVar39 = pIVar22->Flags, (uVar39 >> 0x18 & 1) != 0 &&
             (((uVar39 & 0x210) == 0x10 ||
              ((fVar51 = (pIVar22->ScrollMax).x, fVar51 == 0.0 && (!NAN(fVar51)))))))) {
        pIVar22 = pIVar22->ParentWindow;
      }
      if ((uVar39 & 0x210) == 0) {
        fVar52 = ((pIVar22->InnerRect).Max.x - (pIVar22->InnerRect).Min.x) * 0.67;
        fVar42 = ImGuiWindow::CalcFontSize(pIVar22);
        fVar51 = fVar42 + fVar42;
        if (fVar52 <= fVar42 + fVar42) {
          fVar51 = fVar52;
        }
        (pIVar22->ScrollTarget).x = (pIVar22->Scroll).x - fVar41 * (float)(int)fVar51;
        (pIVar22->ScrollTargetCenterRatio).x = 0.0;
      }
    }
  }
LAB_0014cbd8:
  pIVar34 = GImGui;
  pIVar22 = GImGui->NavWindow;
  if ((((pIVar22 == (ImGuiWindow *)0x0) || (pIVar22->Active != true)) ||
      ((pIVar22->Flags & 0x40000) != 0)) || ((GImGui->IO).KeyCtrl != false)) {
    bVar14 = false;
  }
  else {
    bVar14 = IsKeyPressedMap(0,true);
  }
  pIVar34->FocusTabPressed = bVar14;
  if ((bVar14 == false) || (pIVar34->ActiveId != 0)) {
    pIVar22 = pIVar34->FocusRequestNextWindow;
  }
  else {
    pIVar22 = pIVar34->NavWindow;
    pIVar34->FocusRequestNextWindow = pIVar22;
    pIVar34->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar34->NavId == 0) || (pIVar34->NavIdTabCounter == 0x7fffffff)) {
      iVar19 = -(uint)(pIVar34->IO).KeyShift;
    }
    else {
      iVar19 = pIVar34->NavIdTabCounter + (-(uint)(pIVar34->IO).KeyShift | 1) + 1;
    }
    pIVar34->FocusRequestNextCounterTabStop = iVar19;
  }
  pIVar34->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar34->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar34->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar22 != (ImGuiWindow *)0x0) {
    pIVar34->FocusRequestCurrWindow = pIVar22;
    if ((pIVar34->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar19 = (pIVar22->DC).FocusCounterRegular, iVar19 != -1)) {
      pIVar34->FocusRequestCurrCounterRegular =
           (pIVar34->FocusRequestNextCounterRegular + iVar19 + 1) % (iVar19 + 1);
    }
    if ((pIVar34->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar19 = (pIVar22->DC).FocusCounterTabStop, iVar19 != -1)) {
      pIVar34->FocusRequestCurrCounterTabStop =
           (pIVar34->FocusRequestNextCounterTabStop + iVar19 + 1) % (iVar19 + 1);
    }
    pIVar34->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar34->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar34->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar34->NavIdTabCounter = 0x7fffffff;
  iVar19 = (pIVar12->WindowsFocusOrder).Size;
  if (iVar19 != (pIVar12->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xf23,"void ImGui::NewFrame()");
  }
  fVar41 = (pIVar12->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= fVar41) {
    fVar41 = (float)pIVar12->Time - fVar41;
  }
  else {
    fVar41 = 3.4028235e+38;
  }
  for (i = 0; i != iVar19; i = i + 1) {
    ppIVar24 = ImVector<ImGuiWindow_*>::operator[](&pIVar12->Windows,i);
    pIVar22 = *ppIVar24;
    bVar14 = pIVar22->Active;
    pIVar22->WasActive = bVar14;
    pIVar22->BeginCount = 0;
    pIVar22->Active = false;
    pIVar22->WriteAccessed = false;
    if (((bVar14 == false) && (pIVar22->MemoryCompacted == false)) &&
       (pIVar22->LastTimeActive <= fVar41 && fVar41 != pIVar22->LastTimeActive)) {
      GcCompactTransientWindowBuffers(pIVar22);
    }
    iVar19 = (pIVar12->Windows).Size;
  }
  if ((pIVar12->NavWindow != (ImGuiWindow *)0x0) && (pIVar12->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindow_*>::resize(&pIVar12->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&pIVar12->BeginPopupStack,0);
  ClosePopupsOverWindow(pIVar12->NavWindow,false);
  pIVar34 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar34->DebugItemPickerActive == true) {
    uVar39 = pIVar34->HoveredIdPreviousFrame;
    pIVar34->MouseCursor = 7;
    bVar14 = IsKeyPressedMap(0xe,true);
    if (bVar14) {
      pIVar34->DebugItemPickerActive = false;
    }
    pIVar13 = GImGui;
    fVar41 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar41 != 0.0) || (NAN(fVar41))) {
      uVar40 = (uint)(uVar39 == 0);
    }
    else if (uVar39 == 0) {
      uVar40 = 1;
    }
    else {
      pIVar34->DebugItemPickerBreakId = uVar39;
      pIVar34->DebugItemPickerActive = false;
      uVar40 = 0;
    }
    pIVar4 = &pIVar13->NextWindowData;
    *(byte *)&pIVar4->Flags = (byte)pIVar4->Flags | 0x40;
    (pIVar13->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar39);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar40 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar34 = GImGui;
  }
  pIVar12->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar34->NextWindowData).Flags = (byte)(pIVar34->NextWindowData).Flags | 2;
  (pIVar34->NextWindowData).SizeVal.x = 400.0;
  (pIVar34->NextWindowData).SizeVal.y = 400.0;
  (pIVar34->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar12->CurrentWindow->IsFallbackWindow != false) {
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0xf45,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}